

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void SerializeMany<ParamsStream<ParamsStream<DataStream&,CAddress::SerParams>&,CNetAddr::SerParams>,CNetAddr,Wrapper<CustomUintFormatter<2,true>,unsigned_short_const&>>
               (ParamsStream<ParamsStream<DataStream_&,_CAddress::SerParams>_&,_CNetAddr::SerParams>
                *s,CNetAddr *args,
               Wrapper<CustomUintFormatter<2,_true>,_const_unsigned_short_&> *args_1)

{
  long lVar1;
  long in_FS_OFFSET;
  ParamsStream<ParamsStream<DataStream_&,_CAddress::SerParams>_&,_CNetAddr::SerParams>
  *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Serialize<ParamsStream<ParamsStream<DataStream_&,_CAddress::SerParams>_&,_CNetAddr::SerParams>,_CNetAddr>
            (in_stack_ffffffffffffffd8,(CNetAddr *)0x8a2c84);
  Serialize<ParamsStream<ParamsStream<DataStream_&,_CAddress::SerParams>_&,_CNetAddr::SerParams>,_Wrapper<CustomUintFormatter<2,_true>,_const_unsigned_short_&>_>
            (in_stack_ffffffffffffffd8,
             (Wrapper<CustomUintFormatter<2,_true>,_const_unsigned_short_&> *)0x8a2c93);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}